

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

char * duckdb::WKBGeometryTypes::ToString(WKBGeometryType type)

{
  undefined4 uVar1;
  char *pcVar2;
  NotImplementedException *this;
  undefined6 in_register_0000003a;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = (undefined4)CONCAT62(in_register_0000003a,type);
  switch(uVar1) {
  case 1:
    pcVar2 = "Point";
    break;
  case 2:
    pcVar2 = "LineString";
    break;
  case 3:
    pcVar2 = "Polygon";
    break;
  case 4:
    pcVar2 = "MultiPoint";
    break;
  case 5:
    pcVar2 = "MultiLineString";
    break;
  case 6:
    pcVar2 = "MultiPolygon";
    break;
  case 7:
    pcVar2 = "GeometryCollection";
    break;
  default:
    switch(uVar1) {
    case 0x3e9:
      pcVar2 = "Point Z";
      break;
    case 0x3ea:
      pcVar2 = "LineString Z";
      break;
    case 0x3eb:
      pcVar2 = "Polygon Z";
      break;
    case 0x3ec:
      pcVar2 = "MultiPoint Z";
      break;
    case 0x3ed:
      pcVar2 = "MultiLineString Z";
      break;
    case 0x3ee:
      pcVar2 = "MultiPolygon Z";
      break;
    case 0x3ef:
      pcVar2 = "GeometryCollection Z";
      break;
    default:
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Unsupported geometry type","");
      duckdb::NotImplementedException::NotImplementedException(this,(string *)local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return pcVar2;
}

Assistant:

const char *WKBGeometryTypes::ToString(WKBGeometryType type) {
	switch (type) {
	case WKBGeometryType::POINT:
		return "Point";
	case WKBGeometryType::LINESTRING:
		return "LineString";
	case WKBGeometryType::POLYGON:
		return "Polygon";
	case WKBGeometryType::MULTIPOINT:
		return "MultiPoint";
	case WKBGeometryType::MULTILINESTRING:
		return "MultiLineString";
	case WKBGeometryType::MULTIPOLYGON:
		return "MultiPolygon";
	case WKBGeometryType::GEOMETRYCOLLECTION:
		return "GeometryCollection";
	case WKBGeometryType::POINT_Z:
		return "Point Z";
	case WKBGeometryType::LINESTRING_Z:
		return "LineString Z";
	case WKBGeometryType::POLYGON_Z:
		return "Polygon Z";
	case WKBGeometryType::MULTIPOINT_Z:
		return "MultiPoint Z";
	case WKBGeometryType::MULTILINESTRING_Z:
		return "MultiLineString Z";
	case WKBGeometryType::MULTIPOLYGON_Z:
		return "MultiPolygon Z";
	case WKBGeometryType::GEOMETRYCOLLECTION_Z:
		return "GeometryCollection Z";
	default:
		throw NotImplementedException("Unsupported geometry type");
	}
}